

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix33<float> * __thiscall
Imath_3_2::Matrix33<float>::gjInverse
          (Matrix33<float> *__return_storage_ptr__,Matrix33<float> *this,bool singExc)

{
  ulong uVar1;
  uint uVar2;
  float (*pafVar3) [3];
  invalid_argument *this_00;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  float (*pafVar8) [3];
  float (*pafVar9) [3];
  float *pfVar10;
  float (*pafVar11) [3];
  ulong uVar12;
  float (*pafVar13) [3];
  long lVar14;
  float (*pafVar15) [3];
  ulong uVar16;
  float (*pafVar17) [3];
  float fVar18;
  float fVar19;
  float fVar20;
  Matrix33<float> t;
  Matrix33<float> local_58;
  
  pafVar11 = (float (*) [3])&local_58;
  local_58.x[0][0] = 1.0;
  local_58.x[0][1] = 0.0;
  local_58.x[0][2] = 0.0;
  local_58.x[1][0] = 0.0;
  local_58.x[1][1] = 1.0;
  local_58.x[1][2] = 0.0;
  local_58.x[2][0] = 0.0;
  local_58.x[2][1] = 0.0;
  local_58.x[2][2] = 1.0;
  pafVar13 = (float (*) [3])&t;
  Matrix33((Matrix33<float> *)pafVar13,this);
  pafVar3 = t.x + 1;
  uVar4 = 1;
  lVar5 = 0x18;
  pafVar8 = (float (*) [3])&local_58;
  pafVar9 = pafVar3;
  uVar16 = 0;
  do {
    pafVar8 = pafVar8 + 1;
    if (uVar16 == 2) {
      uVar2 = 2;
      while( true ) {
        if ((int)uVar2 < 0) {
          Matrix33(__return_storage_ptr__,&local_58);
          return __return_storage_ptr__;
        }
        uVar4 = (ulong)uVar2;
        fVar19 = *(float *)((long)t.x + uVar4 * 0x10);
        if ((fVar19 == 0.0) && (!NAN(fVar19))) break;
        for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
          t.x[uVar4][lVar5] = t.x[uVar4][lVar5] / fVar19;
          local_58.x[uVar4][lVar5] = local_58.x[uVar4][lVar5] / fVar19;
        }
        pafVar11 = (float (*) [3])&local_58;
        pafVar13 = (float (*) [3])&t;
        for (uVar16 = 0; uVar16 != uVar4; uVar16 = uVar16 + 1) {
          fVar19 = -t.x[uVar16][uVar4];
          for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
            (*(float (*) [3])*pafVar13)[lVar5] =
                 t.x[uVar4][lVar5] * fVar19 + (*(float (*) [3])*pafVar13)[lVar5];
            (*(float (*) [3])*pafVar11)[lVar5] =
                 local_58.x[uVar4][lVar5] * fVar19 + (*(float (*) [3])*pafVar11)[lVar5];
          }
          pafVar13 = pafVar13 + 1;
          pafVar11 = pafVar11 + 1;
        }
        uVar2 = uVar2 - 1;
      }
      if (!singExc) {
LAB_0013859b:
        Matrix33(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Cannot invert singular matrix.");
LAB_001385eb:
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    pfVar10 = (float *)((long)t.x + uVar16 * 0x10);
    fVar19 = *pfVar10;
    fVar18 = -fVar19;
    if (-fVar19 <= fVar19) {
      fVar18 = fVar19;
    }
    uVar12 = uVar4 & 0xffffffff;
    uVar7 = uVar16 & 0xffffffff;
    for (lVar14 = 0; lVar5 != lVar14; lVar14 = lVar14 + 0xc) {
      fVar19 = *(float *)((long)*pafVar9 + lVar14);
      fVar20 = -fVar19;
      if (-fVar19 <= fVar19) {
        fVar20 = fVar19;
      }
      uVar1 = uVar12;
      if (fVar20 <= fVar18) {
        fVar20 = fVar18;
        uVar1 = uVar7;
      }
      uVar7 = uVar1;
      fVar18 = fVar20;
      uVar12 = (ulong)((int)uVar12 + 1);
    }
    if ((fVar18 == 0.0) && (!NAN(fVar18))) {
      if (!singExc) goto LAB_0013859b;
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Cannot invert singular matrix.");
      goto LAB_001385eb;
    }
    iVar6 = (int)uVar7;
    pafVar15 = pafVar8;
    pafVar17 = pafVar3;
    uVar12 = uVar4;
    if (uVar16 != uVar7) {
      for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
        fVar19 = (*(float (*) [3])*pafVar13)[lVar14];
        (*(float (*) [3])*pafVar13)[lVar14] = t.x[iVar6][lVar14];
        t.x[iVar6][lVar14] = fVar19;
        fVar19 = (*(float (*) [3])*pafVar11)[lVar14];
        (*(float (*) [3])*pafVar11)[lVar14] = local_58.x[iVar6][lVar14];
        local_58.x[iVar6][lVar14] = fVar19;
      }
    }
    for (; uVar12 != 3; uVar12 = uVar12 + 1) {
      fVar19 = -t.x[uVar12][uVar16] / *pfVar10;
      for (lVar14 = 0; lVar14 != 0xc; lVar14 = lVar14 + 4) {
        *(float *)((long)*pafVar17 + lVar14) =
             *(float *)((long)*(float (*) [3])*pafVar13 + lVar14) * fVar19 +
             *(float *)((long)*pafVar17 + lVar14);
        *(float *)((long)*pafVar15 + lVar14) =
             *(float *)((long)*(float (*) [3])*pafVar11 + lVar14) * fVar19 +
             *(float *)((long)*pafVar15 + lVar14);
      }
      pafVar15 = pafVar15 + 1;
      pafVar17 = pafVar17 + 1;
    }
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + -0xc;
    pafVar9 = (float (*) [3])(pafVar9[1] + 1);
    pafVar13 = pafVar13 + 1;
    pafVar11 = pafVar11 + 1;
    pafVar3 = pafVar3 + 1;
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

inline Matrix33<T>
Matrix33<T>::gjInverse (bool singExc) const
{
    int      i, j, k;
    Matrix33 s;
    Matrix33 t (*this);

    // Forward elimination

    for (i = 0; i < 2; i++)
    {
        int pivot = i;

        T pivotsize = t.x[i][i];

        if (pivotsize < 0) pivotsize = -pivotsize;

        for (j = i + 1; j < 3; j++)
        {
            T tmp = t.x[j][i];

            if (tmp < 0) tmp = -tmp;

            if (tmp > pivotsize)
            {
                pivot     = j;
                pivotsize = tmp;
            }
        }

        if (pivotsize == 0)
        {
            if (singExc)
                throw std::invalid_argument ("Cannot invert singular matrix.");

            return Matrix33 ();
        }

        if (pivot != i)
        {
            for (j = 0; j < 3; j++)
            {
                T tmp;

                tmp           = t.x[i][j];
                t.x[i][j]     = t.x[pivot][j];
                t.x[pivot][j] = tmp;

                tmp           = s.x[i][j];
                s.x[i][j]     = s.x[pivot][j];
                s.x[pivot][j] = tmp;
            }
        }

        for (j = i + 1; j < 3; j++)
        {
            T f = t.x[j][i] / t.x[i][i];

            for (k = 0; k < 3; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    // Backward substitution

    for (i = 2; i >= 0; --i)
    {
        T f;

        if ((f = t[i][i]) == 0)
        {
            if (singExc)
                throw std::invalid_argument ("Cannot invert singular matrix.");

            return Matrix33 ();
        }

        for (j = 0; j < 3; j++)
        {
            t.x[i][j] /= f;
            s.x[i][j] /= f;
        }

        for (j = 0; j < i; j++)
        {
            f = t.x[j][i];

            for (k = 0; k < 3; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    return s;
}